

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O2

void aom_noise_tx_filter(aom_noise_tx_t *noise_tx,float *psd)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  
  uVar2 = noise_tx->block_size;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (uVar6 = 0; lVar7 = lVar4, uVar8 = (ulong)uVar2, uVar6 != uVar5; uVar6 = uVar6 + 1) {
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      pfVar3 = noise_tx->tx_block;
      fVar1 = pfVar3[lVar7 * 2];
      fVar10 = ABS(fVar1);
      if (fVar10 <= 1e-08) {
        fVar10 = 1e-08;
      }
      fVar11 = ABS(pfVar3[lVar7 * 2 + 1]);
      if (fVar11 <= 1e-08) {
        fVar11 = 1e-08;
      }
      fVar10 = fVar10 * fVar10 + fVar11 * fVar11;
      if ((fVar10 <= psd[lVar7] * 1.1) || (fVar10 <= 1e-06)) {
        pfVar3[lVar7 * 2] = fVar1 * 0.09090911;
        fVar11 = 0.09090911;
      }
      else {
        fVar11 = fVar10;
        if (fVar10 <= 1e-06) {
          fVar11 = 1e-06;
        }
        pfVar3[lVar7 * 2] = fVar1 * ((fVar10 - psd[lVar7]) / fVar11);
        fVar11 = (fVar10 - psd[lVar7]) / fVar11;
      }
      pfVar3[lVar7 * 2 + 1] = fVar11 * pfVar3[lVar7 * 2 + 1];
      lVar7 = lVar7 + 1;
    }
    lVar4 = lVar4 + (int)uVar2;
  }
  return;
}

Assistant:

void aom_noise_tx_filter(struct aom_noise_tx_t *noise_tx, const float *psd) {
  const int block_size = noise_tx->block_size;
  const float kBeta = 1.1f;
  const float kEps = 1e-6f;
  for (int y = 0; y < block_size; ++y) {
    for (int x = 0; x < block_size; ++x) {
      int i = y * block_size + x;
      float *c = noise_tx->tx_block + 2 * i;
      const float c0 = AOMMAX((float)fabs(c[0]), 1e-8f);
      const float c1 = AOMMAX((float)fabs(c[1]), 1e-8f);
      const float p = c0 * c0 + c1 * c1;
      if (p > kBeta * psd[i] && p > 1e-6) {
        noise_tx->tx_block[2 * i + 0] *= (p - psd[i]) / AOMMAX(p, kEps);
        noise_tx->tx_block[2 * i + 1] *= (p - psd[i]) / AOMMAX(p, kEps);
      } else {
        noise_tx->tx_block[2 * i + 0] *= (kBeta - 1.0f) / kBeta;
        noise_tx->tx_block[2 * i + 1] *= (kBeta - 1.0f) / kBeta;
      }
    }
  }
}